

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O2

void TPZShapeHDivConstant<pzshape::TPZShapeTriang>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  int *piVar1;
  ulong uVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  TPZManVector<int,_20> local_90;
  
  TPZManVector<int,_20>::TPZManVector(&local_90,sideorient);
  TPZManVector<int,_20>::operator=(&data->fSideOrient,&local_90);
  TPZManVector<int,_20>::~TPZManVector(&local_90);
  TPZManVector<int,_27>::Resize(&data->fHDivConnectOrders,4);
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,4);
  piVar1 = connectorders->fStore;
  uVar2 = connectorders->fNElements;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = uVar2 & 0xffffffff;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    piVar3 = piVar1 + uVar6;
    *piVar3 = *piVar3 + 1;
  }
  piVar1 = (int *)((long)piVar1 + ((long)((uVar2 << 0x20) + -0x100000000) >> 0x1e));
  *piVar1 = *piVar1 + 1;
  TPZShapeH1<pzshape::TPZShapeTriang>::Initialize(ids,connectorders,data);
  piVar1 = connectorders->fStore;
  piVar3 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore;
  piVar4 = (data->fH1NumConnectShape).super_TPZVec<int>.fStore;
  piVar5 = (data->fHDivNumConnectShape).super_TPZVec<int>.fStore;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    piVar3[lVar8] = piVar1[lVar8];
    piVar5[lVar8] = piVar4[lVar8] + 1;
  }
  piVar3[3] = piVar1[3];
  piVar5[3] = piVar4[3];
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Initialize(TPZVec<int64_t> &ids,
                TPZVec<int> &connectorders,
                const TPZVec<int>& sideorient, 
                TPZShapeData &data)
{
    data.fSideOrient = sideorient;
    data.fHDivConnectOrders.Resize(TSHAPE::NFacets+1);
    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    if(TSHAPE::Dimension == 2)
    {
        //Compatibilize the polynomial order
        int conSize = connectorders.size();
        for (int i = 0; i < conSize; i++){
            connectorders[i]++;
        }
        if (TSHAPE::Type() == ETriangle){
            connectorders[conSize-1]++;
        }
        //Initialize data structures
        TPZShapeH1<TSHAPE>::Initialize(ids,connectorders,data);

        for(int ic = 0; ic<TSHAPE::NFacets;ic++)
        {
            data.fHDivConnectOrders[ic] =  connectorders[ic];
            data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic]+1;
        }
        int ic = TSHAPE::NFacets;
        data.fHDivConnectOrders[ic] =  connectorders[ic];
        data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic];
    }
    else
    {
        //Compatibilize the polynomial order
        if (TSHAPE::Type() == ETetraedro) {
            int conSize = connectorders.size();
            for (int i = 0; i < conSize; i++){
                connectorders[i]++;
            }
            connectorders[conSize-1]++;
        }

        const int nedges = TSHAPE::NSides-TSHAPE::NFacets-TSHAPE::NCornerNodes-1;
        TPZManVector<int,15> locconorders(TSHAPE::NSides-TSHAPE::NCornerNodes,1);
        for(int ic = nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes; ic++)
        {
            locconorders[ic] = connectorders[ic-nedges];
        }
        TPZShapeHCurlNoGrads<TSHAPE>::Initialize(ids, locconorders, data);
//        TPZManVector<int> HCurlNumConnectShapeF = data.fHDivNumConnectShape;
//        data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
//        for(int ic=nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes-1; ic++)
//        {
//            int numshape = HCurlNumConnectShapeF[ic]+1;
//            data.fHDivNumConnectShape[ic-nedges] = numshape;
//        }
//        int ic = TSHAPE::NSides-TSHAPE::NCornerNodes-1;
//        int numshape = HCurlNumConnectShapeF[ic];
//        data.fHDivNumConnectShape[ic-nedges] = numshape;
    }
}